

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long_double>::Subtract
          (TPZMatrix<long_double> *this,TPZMatrix<long_double> *A,TPZMatrix<long_double> *res)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int64_t iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TPZMatrix<long_double> *aBase;
  long *in_RDX;
  TPZFMatrix<long_double> *in_RSI;
  TPZBaseMatrix *in_RDI;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar7;
  longdouble in_ST7;
  longdouble lVar8;
  int64_t c;
  int64_t r;
  TPZFMatrix<long_double> *resFmat;
  TPZFMatrix<long_double> *aFmat;
  TPZFMatrix<long_double> *thisFmat;
  TPZMatrix<long_double> *in_stack_fffffffffffffe18;
  long lVar9;
  long local_1d8;
  long local_1b8;
  longdouble local_58;
  long local_40;
  long local_38;
  long local_30;
  TPZMatrix<long_double> *local_28;
  long local_20;
  long *plVar10;
  TPZFMatrix<long_double> *pTVar11;
  
  iVar5 = TPZBaseMatrix::Rows(in_RDI);
  iVar6 = TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RSI);
  if (iVar5 == iVar6) {
    iVar5 = TPZBaseMatrix::Cols(in_RDI);
    iVar6 = TPZBaseMatrix::Cols((TPZBaseMatrix *)in_RSI);
    if (iVar5 == iVar6) goto LAB_012c7f3f;
  }
  Error((char *)in_RSI,(char *)in_RDX);
LAB_012c7f3f:
  iVar3 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4b])();
  iVar4 = (*(in_RSI->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x4b])();
  if (CONCAT44(extraout_var,iVar3) != CONCAT44(extraout_var_00,iVar4)) {
    std::operator<<((ostream *)&std::cerr,
                    "void TPZMatrix<long double>::Subtract(const TPZMatrix<TVar> &, TPZMatrix<TVar> &) const [T = long double]"
                   );
    std::operator<<((ostream *)&std::cerr,"ERROR\nDifferent number of entries.\nAborting...\n");
    pzinternal::DebugStopImpl((char *)this,(size_t)A);
  }
  (**(code **)(*in_RDX + 0xf8))(in_RDX,in_RDI);
  if (in_RDI == (TPZBaseMatrix *)0x0) {
    local_1b8 = 0;
  }
  else {
    local_1b8 = __dynamic_cast(in_RDI,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
  }
  local_20 = local_1b8;
  pTVar11 = in_RSI;
  if (in_RSI == (TPZFMatrix<long_double> *)0x0) {
    aBase = (TPZMatrix<long_double> *)0x0;
  }
  else {
    aBase = (TPZMatrix<long_double> *)
            __dynamic_cast(in_RSI,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
  }
  local_28 = aBase;
  if (in_RDX == (long *)0x0) {
    local_1d8 = 0;
  }
  else {
    local_1d8 = __dynamic_cast(in_RDX,&typeinfo,&TPZFMatrix<long_double>::typeinfo,0);
  }
  local_30 = local_1d8;
  if ((local_1d8 == 0) || ((local_20 != 0 && (local_28 != (TPZMatrix<long_double> *)0x0)))) {
    (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x4a])(in_RDI,in_RDX,pTVar11);
    Storage(in_stack_fffffffffffffe18);
    Storage(in_stack_fffffffffffffe18);
    TPZFMatrix<long_double>::operator-=(in_RSI,aBase);
    TPZFMatrixRef<long_double>::~TPZFMatrixRef((TPZFMatrixRef<long_double> *)0x12c8261);
    TPZFMatrix<long_double>::~TPZFMatrix((TPZFMatrix<long_double> *)0x12c826e);
  }
  else {
    for (local_38 = 0; lVar1 = local_38, iVar5 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar5;
        local_38 = local_38 + 1) {
      local_40 = 0;
      while (lVar9 = local_40, iVar5 = TPZBaseMatrix::Cols(in_RDI), lVar2 = local_38,
            lVar1 = local_40, lVar9 < iVar5) {
        plVar10 = in_RDX;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])();
        (*(pTVar11->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(pTVar11,local_38,local_40);
        local_58 = in_ST0 - in_ST1;
        lVar7 = in_ST7;
        lVar8 = in_ST7;
        (**(code **)(*in_RDX + 0x118))(in_RDX,lVar2,lVar1,&local_58);
        local_40 = local_40 + 1;
        in_ST0 = in_ST2;
        in_ST1 = in_ST3;
        in_ST2 = in_ST4;
        in_ST3 = in_ST5;
        in_ST4 = in_ST6;
        in_ST5 = in_ST7;
        in_ST6 = lVar7;
        in_ST7 = lVar8;
        in_RDX = plVar10;
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::Subtract(const TPZMatrix<TVar> &A,TPZMatrix<TVar> &res) const {
	
	if ((Rows() != A.Rows()) || (Cols() != A.Cols()) ) {
		Error( "Add(TPZMatrix<>&, TPZMatrix<>&) <different dimensions>" );
	}
	if(this->Size()!=A.Size()){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<"ERROR\nDifferent number of entries.\nAborting...\n";
    DebugStop();
  }
  res.CopyFrom(this);
  auto thisFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(this);
  auto aFmat =
    dynamic_cast<const TPZFMatrix<TVar>*>(&A);
  auto resFmat =
    dynamic_cast<TPZFMatrix<TVar>*>(&res);
  if(resFmat && (!thisFmat || !aFmat)){
    for ( int64_t r = 0; r < Rows(); r++ )
      for ( int64_t c = 0; c < Cols(); c++ )
        res.PutVal( r, c, GetVal(r,c)-A.GetVal(r,c) );
  }else{
    CheckTypeCompatibility(&res,&A);
    res.Storage() -= A.Storage();
  }
}